

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O3

uchar * nvpair_unpack_number_array(_Bool isbe,nvpair_t *nvp,uchar *ptr,size_t *leftp)

{
  size_t __size;
  int *piVar1;
  void *pvVar2;
  uint uVar3;
  ulong uVar4;
  uint8_t *p;
  ulong uVar5;
  ulong uVar6;
  
  if (nvp->nvp_type != 9) {
    __assert_fail("nvp->nvp_type == 9",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x398,
                  "const unsigned char *nvpair_unpack_number_array(_Bool, nvpair_t *, const unsigned char *, size_t *)"
                 );
  }
  __size = nvp->nvp_nitems * 8;
  if ((nvp->nvp_datasize == __size) &&
     (uVar6 = *leftp, nvp->nvp_nitems - 1 < __size && __size <= uVar6)) {
    pvVar2 = malloc(__size);
    if (pvVar2 != (void *)0x0) {
      uVar3 = 1;
      uVar4 = 0;
      do {
        uVar6 = uVar6 - 8;
        if (isbe) {
          uVar5 = *(ulong *)ptr;
          uVar5 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
                  (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
                  (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28
                  | uVar5 << 0x38;
        }
        else {
          uVar5 = *(ulong *)ptr;
        }
        *(ulong *)((long)pvVar2 + uVar4 * 8) = uVar5;
        ptr = (uchar *)((long)ptr + 8);
        *leftp = uVar6;
        uVar4 = (ulong)uVar3;
        uVar3 = uVar3 + 1;
      } while (uVar4 < nvp->nvp_nitems);
      nvp->nvp_data = (uint64_t)pvVar2;
      return (uchar *)(ulong *)ptr;
    }
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
  }
  return (uchar *)0x0;
}

Assistant:

const unsigned char *
nvpair_unpack_number_array(bool isbe, nvpair_t *nvp, const unsigned char *ptr,
     size_t *leftp)
{
	uint64_t *value;
	size_t size;
	unsigned int i;

	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_NUMBER_ARRAY);

	size = sizeof(*value) * nvp->nvp_nitems;
	if (nvp->nvp_datasize != size || *leftp < size ||
	    nvp->nvp_nitems == 0 || size < nvp->nvp_nitems) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	value = nv_malloc(size);
	if (value == NULL)
		return (NULL);

	for (i = 0; i < nvp->nvp_nitems; i++) {
		if (isbe)
			value[i] = be64dec(ptr);
		else
			value[i] = le64dec(ptr);

		ptr += sizeof(*value);
		*leftp -= sizeof(*value);
	}

	nvp->nvp_data = (uint64_t)(uintptr_t)value;

	return (ptr);
}